

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECParameters.cpp
# Opt level: O0

bool __thiscall ECParameters::deserialise(ECParameters *this,ByteString *serialised)

{
  size_t sVar1;
  ByteString *in_RDI;
  ByteString dEC;
  ECParameters *this_00;
  ByteString *in_stack_ffffffffffffffb8;
  ECParameters local_40;
  byte local_1;
  
  this_00 = &local_40;
  ByteString::chainDeserialise(in_stack_ffffffffffffffb8);
  sVar1 = ByteString::size((ByteString *)0x1a7325);
  local_1 = sVar1 != 0;
  if ((bool)local_1) {
    setEC(this_00,in_RDI);
  }
  ByteString::~ByteString((ByteString *)0x1a7387);
  return (bool)(local_1 & 1);
}

Assistant:

bool ECParameters::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);

	if (dEC.size() == 0)
	{
		return false;
	}

	setEC(dEC);

	return true;
}